

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateExtensionsList
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *type)

{
  bool bVar1;
  __type_conflict _Var2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  byte local_1ab;
  allocator<char> local_1aa;
  byte local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  type *local_108;
  type *leave;
  type *enter;
  string local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  reference local_88;
  ExtensionData *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  *__range1;
  string previousLeave;
  string previousEnter;
  string *type_local;
  VulkanHppGenerator *this_local;
  string *extensionsList;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(previousLeave.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while (bVar1 = __gnu_cxx::
                 operator==<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                           (&__end1,(__normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                                     *)&extension), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
               ::operator*(&__end1);
    _Var2 = std::operator==(&local_88->type,type);
    if (_Var2) {
      getProtectFromTitle(&local_e8,this,&local_88->name);
      generateProtection(&local_c8,this,&local_e8,true);
      std::__cxx11::string::~string((string *)&local_e8);
      leave = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(&local_c8);
      local_108 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(&local_c8);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&previousLeave.field_2 + 8),leave);
      local_1a9 = 0;
      local_1ab = 0;
      if (((_Var2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        local_1ab = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"\n",&local_1aa);
      }
      else {
        std::operator+(&local_1a8,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1);
        local_1a9 = 1;
        std::operator+(&local_188,&local_1a8,leave);
      }
      std::operator+(&local_168,&local_188,"\"");
      std::operator+(&local_148,&local_168,&local_88->name);
      std::operator+(&local_128,&local_148,"\", ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      if ((local_1ab & 1) != 0) {
        std::allocator<char>::~allocator(&local_1aa);
      }
      if ((local_1a9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&previousLeave.field_2 + 8),leave);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 local_108);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_c8);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                    (__return_storage_ptr__,", ");
  if (!bVar1) {
    __assert_fail("extensionsList.ends_with( \", \" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x1dc5,
                  "std::string VulkanHppGenerator::generateExtensionsList(const std::string &) const"
                 );
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_1d0,__return_storage_ptr__,0,sVar3 - 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1)
  ;
  if (!bVar1) {
    std::operator+(&local_1f0,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(previousLeave.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateExtensionsList( std::string const & type ) const
{
  std::string extensionsList, previousEnter, previousLeave;
  for ( auto const & extension : m_extensions )
  {
    if ( extension.type == type )
    {
      const auto [enter, leave] = generateProtection( getProtectFromTitle( extension.name ) );
      extensionsList += ( ( previousEnter != enter ) ? ( "\n" + previousLeave + enter ) : "\n" ) + "\"" + extension.name + "\", ";
      previousEnter = enter;
      previousLeave = leave;
    }
  }
  assert( extensionsList.ends_with( ", " ) );
  extensionsList = extensionsList.substr( 0, extensionsList.length() - 2 );
  if ( !previousLeave.empty() )
  {
    extensionsList += "\n" + previousLeave;
  }
  return extensionsList;
}